

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O0

Lazy<void> __thiscall
cinatra::coro_http_client::send_file_no_copy_with_chunked
          (coro_http_client *this,path *source,error_code *ec)

{
  undefined8 *puVar1;
  basic_string_view<char,_std::char_traits<char>_> data;
  basic_string_view<char,_std::char_traits<char>_> data_00;
  basic_string_view<char,_std::char_traits<char>_> data_01;
  bool bVar2;
  undefined8 *puVar3;
  LazyPromise<void> *this_00;
  long lVar4;
  unsigned_long *puVar5;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 *extraout_RAX_01;
  __enable_if_t<__assignable<std::error_code,_unsigned_long>(),_tuple<error_code_&,_unsigned_long_&>_&>
  ptVar6;
  undefined8 *extraout_RAX_02;
  undefined8 *extraout_RAX_03;
  long in_RCX;
  long *plVar7;
  long *plVar8;
  long *plVar9;
  unsigned_long *puVar10;
  unsigned_long *puVar11;
  undefined8 in_RDX;
  undefined8 in_RSI;
  LazyBase<void,_false> in_RDI;
  error_code eVar12;
  const_buffer cVar13;
  array<char,_24UL> *in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffae4;
  undefined4 in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaec;
  undefined4 in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf4;
  coro_http_client *in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb04;
  int local_460;
  int local_438;
  int local_3fc;
  int local_3f4;
  size_t in_stack_fffffffffffffdf0;
  off_t in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffe04;
  socket *in_stack_fffffffffffffe08;
  undefined4 uStack_18c;
  unsigned_long local_b8 [4];
  int local_98;
  undefined4 uStack_94;
  error_category *local_90;
  long local_40;
  undefined8 local_38;
  
  local_40 = in_RCX;
  local_38 = in_RDX;
  puVar3 = (undefined8 *)operator_new(0x1e0,(nothrow_t *)&std::nothrow);
  if (puVar3 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<void>::get_return_object_on_allocation_failure();
    return (Lazy<void>)in_RDI._coro.__handle_.__handle_;
  }
  *puVar3 = send_file_no_copy_with_chunked;
  puVar3[1] = send_file_no_copy_with_chunked;
  plVar7 = puVar3 + 0x23;
  plVar8 = puVar3 + 0x25;
  plVar9 = puVar3 + 0x26;
  puVar10 = puVar3 + 0x27;
  puVar11 = puVar3 + 0x2b;
  this_00 = (LazyPromise<void> *)(puVar3 + 2);
  puVar3[0x36] = in_RSI;
  puVar3[0x22] = local_38;
  *plVar7 = local_40;
  async_simple::coro::detail::LazyPromise<void>::LazyPromise
            ((LazyPromise<void> *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
  async_simple::coro::detail::LazyPromise<void>::get_return_object
            ((LazyPromise<void> *)in_stack_fffffffffffffaf8);
  async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)this_00);
  bVar2 = std::suspend_always::await_ready((suspend_always *)((long)puVar3 + 0x1d9));
  if (!bVar2) {
    *(undefined1 *)(puVar3 + 0x3b) = 0;
    send_file_no_copy_with_chunked
              ((void *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
               (void *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    return (Lazy<void>)in_RDI._coro.__handle_.__handle_;
  }
  std::suspend_always::await_resume((suspend_always *)((long)puVar3 + 0x1d9));
  std::filesystem::__cxx11::path::c_str((path *)0x68e31e);
  fd_guard::fd_guard((fd_guard *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                     in_stack_fffffffffffffad8->_M_elems);
  if (*(int *)(puVar3 + 0x37) < 0) {
    eVar12 = std::make_error_code(0);
    local_90 = eVar12._M_cat;
    local_98 = eVar12._M_value;
    puVar1 = (undefined8 *)*plVar7;
    *puVar1 = CONCAT44(uStack_94,local_98);
    puVar1[1] = local_90;
    async_simple::coro::detail::LazyPromise<void>::return_void(this_00);
    local_3f4 = 3;
  }
  else {
    *plVar8 = 0;
    lVar4 = std::filesystem::file_size((path *)puVar3[0x22],(error_code *)*plVar7);
    *plVar9 = lVar4;
    bVar2 = std::error_code::operator_cast_to_bool((error_code *)*plVar7);
    if (bVar2) {
      async_simple::coro::detail::LazyPromise<void>::return_void(this_00);
      local_3fc = 3;
    }
    else {
      local_b8[0] = *plVar9 - *plVar8;
      puVar5 = std::min<unsigned_long>((unsigned_long *)(puVar3[0x36] + 0xf40),local_b8);
      *puVar10 = *puVar5;
      get_chuncked_buffers<true,false>
                (CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                 (array<char,_24UL> *)in_stack_fffffffffffffaf8);
      data._M_len._4_4_ = in_stack_fffffffffffffaec;
      data._M_len._0_4_ = in_stack_fffffffffffffae8;
      data._M_str._0_4_ = in_stack_fffffffffffffaf0;
      data._M_str._4_4_ = in_stack_fffffffffffffaf4;
      cVar13 = (const_buffer)asio::buffer<char,std::char_traits<char>>(data);
      *(const_buffer *)(puVar3 + 0x12) = cVar13;
      async_write<asio::const_buffers_1>
                (in_stack_fffffffffffffaf8,
                 (const_buffers_1 *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
      async_simple::coro::detail::LazyPromiseBase::
      await_transform<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
                ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                 (Lazy<std::pair<std::error_code,_unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
      bVar2 = async_simple::coro::detail::
              LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::await_ready
                        ((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                         (puVar3 + 0x29));
      if (!bVar2) {
        *(undefined1 *)(puVar3 + 0x3b) = 1;
        send_file_no_copy_with_chunked
                  ((void *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                   in_stack_fffffffffffffaf8);
        (*(code *)*extraout_RAX)(extraout_RAX);
        return (Lazy<void>)in_RDI._coro.__handle_.__handle_;
      }
      puVar3[0x1e] = (LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)(puVar3 + 0x29);
      async_simple::coro::detail::LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::
      awaitResume((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                  CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
      std::tie<std::error_code,unsigned_long>
                ((error_code *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
      std::tuple<std::error_code&,unsigned_long&>::operator=
                ((tuple<std::error_code_&,_unsigned_long_&> *)
                 CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                 (pair<std::error_code,_unsigned_long> *)
                 CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
      async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>::
      ValueAwaiter::~ValueAwaiter((ValueAwaiter *)0x68e6e2);
      async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
                ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x68e6ef);
      bVar2 = std::error_code::operator_cast_to_bool((error_code *)*plVar7);
      if (bVar2) {
        async_simple::coro::detail::LazyPromise<void>::return_void(this_00);
        local_438 = 3;
      }
      else {
        do {
          *puVar11 = 0;
          std::
          __shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x68e795);
          coro_io::async_sendfile
                    (in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,in_stack_fffffffffffffdf8,
                     in_stack_fffffffffffffdf0);
          async_simple::coro::detail::LazyPromiseBase::
          await_transform<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
                    ((LazyPromiseBase *)
                     CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                     (Lazy<std::pair<std::error_code,_unsigned_long>_> *)
                     CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
          bVar2 = async_simple::coro::detail::
                  LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::await_ready
                            ((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                             (puVar3 + 0x2c));
          if (!bVar2) {
            *(undefined1 *)(puVar3 + 0x3b) = 2;
            send_file_no_copy_with_chunked
                      ((void *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                       in_stack_fffffffffffffaf8);
            (*(code *)*extraout_RAX_00)(extraout_RAX_00);
            return (Lazy<void>)in_RDI._coro.__handle_.__handle_;
          }
          puVar3[0x1f] = (LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                         (puVar3 + 0x2c);
          async_simple::coro::detail::LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::
          awaitResume((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                      CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
          std::tie<std::error_code,unsigned_long>
                    ((error_code *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                     (unsigned_long *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0))
          ;
          ptVar6 = std::tuple<std::error_code&,unsigned_long&>::operator=
                             ((tuple<std::error_code_&,_unsigned_long_&> *)
                              CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                              (pair<std::error_code,_unsigned_long> *)
                              CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
          puVar3[0x2e] = ptVar6;
          async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>::
          ValueAwaiter::~ValueAwaiter((ValueAwaiter *)0x68e956);
          async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
                    ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x68e963);
          bVar2 = std::error_code::operator_cast_to_bool((error_code *)*plVar7);
          if (bVar2) {
            async_simple::coro::detail::LazyPromise<void>::return_void(this_00);
            local_460 = 3;
          }
          else if (*puVar11 == *puVar10) {
            *plVar8 = *puVar11 + *plVar8;
            if (*plVar8 < *plVar9) {
              puVar3[0x2f] = *plVar9 - *plVar8;
              puVar5 = std::min<unsigned_long>
                                 ((unsigned_long *)(puVar3[0x36] + 0xf40),puVar3 + 0x2f);
              *puVar10 = *puVar5;
              get_chuncked_buffers<false,false>
                        (CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                         (array<char,_24UL> *)in_stack_fffffffffffffaf8);
              data_00._M_len._4_4_ = in_stack_fffffffffffffaec;
              data_00._M_len._0_4_ = in_stack_fffffffffffffae8;
              data_00._M_str._0_4_ = in_stack_fffffffffffffaf0;
              data_00._M_str._4_4_ = in_stack_fffffffffffffaf4;
              cVar13 = (const_buffer)asio::buffer<char,std::char_traits<char>>(data_00);
              *(const_buffer *)(puVar3 + 0x16) = cVar13;
              async_write<asio::const_buffers_1>
                        (in_stack_fffffffffffffaf8,
                         (const_buffers_1 *)
                         CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
              async_simple::coro::detail::LazyPromiseBase::
              await_transform<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
                        ((LazyPromiseBase *)
                         CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                         (Lazy<std::pair<std::error_code,_unsigned_long>_> *)
                         CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
              bVar2 = async_simple::coro::detail::
                      LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::await_ready
                                ((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                                 (puVar3 + 0x30));
              if (!bVar2) {
                *(undefined1 *)(puVar3 + 0x3b) = 3;
                send_file_no_copy_with_chunked
                          ((void *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                           in_stack_fffffffffffffaf8);
                (*(code *)*extraout_RAX_01)(extraout_RAX_01);
                return (Lazy<void>)in_RDI._coro.__handle_.__handle_;
              }
              puVar3[0x20] = (LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                             (puVar3 + 0x30);
              async_simple::coro::detail::
              LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::awaitResume
                        ((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                         CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
              std::tie<std::error_code,unsigned_long>
                        ((error_code *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8)
                         ,(unsigned_long *)
                          CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
              ptVar6 = std::tuple<std::error_code&,unsigned_long&>::operator=
                                 ((tuple<std::error_code_&,_unsigned_long_&> *)
                                  CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                                  (pair<std::error_code,_unsigned_long> *)
                                  CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
              puVar3[0x32] = ptVar6;
              async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>
              ::ValueAwaiter::~ValueAwaiter((ValueAwaiter *)0x68ed2a);
              async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
                        ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x68ed37);
              bVar2 = std::error_code::operator_cast_to_bool((error_code *)*plVar7);
              if (bVar2) {
                async_simple::coro::detail::LazyPromise<void>::return_void(this_00);
                local_460 = 3;
              }
              else {
                local_460 = 0;
              }
            }
            else {
              get_chuncked_buffers<false,true>
                        (CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                         in_stack_fffffffffffffad8);
              data_01._M_len._4_4_ = in_stack_fffffffffffffaec;
              data_01._M_len._0_4_ = in_stack_fffffffffffffae8;
              data_01._M_str._0_4_ = in_stack_fffffffffffffaf0;
              data_01._M_str._4_4_ = in_stack_fffffffffffffaf4;
              cVar13 = (const_buffer)asio::buffer<char,std::char_traits<char>>(data_01);
              *(const_buffer *)(puVar3 + 0x1a) = cVar13;
              async_write<asio::const_buffers_1>
                        (in_stack_fffffffffffffaf8,
                         (const_buffers_1 *)
                         CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
              async_simple::coro::detail::LazyPromiseBase::
              await_transform<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
                        ((LazyPromiseBase *)
                         CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                         (Lazy<std::pair<std::error_code,_unsigned_long>_> *)
                         CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
              bVar2 = async_simple::coro::detail::
                      LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::await_ready
                                ((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                                 (puVar3 + 0x33));
              if (!bVar2) {
                *(undefined1 *)(puVar3 + 0x3b) = 4;
                send_file_no_copy_with_chunked
                          ((void *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                           in_stack_fffffffffffffaf8);
                (*(code *)*extraout_RAX_02)(extraout_RAX_02);
                return (Lazy<void>)in_RDI._coro.__handle_.__handle_;
              }
              puVar3[0x21] = (LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                             (puVar3 + 0x33);
              async_simple::coro::detail::
              LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::awaitResume
                        ((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                         CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
              std::tie<std::error_code,unsigned_long>
                        ((error_code *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8)
                         ,(unsigned_long *)
                          CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
              ptVar6 = std::tuple<std::error_code&,unsigned_long&>::operator=
                                 ((tuple<std::error_code_&,_unsigned_long_&> *)
                                  CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                                  (pair<std::error_code,_unsigned_long> *)
                                  CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
              puVar3[0x35] = ptVar6;
              async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>
              ::ValueAwaiter::~ValueAwaiter((ValueAwaiter *)0x68efe1);
              async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
                        ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x68efee);
              bVar2 = std::error_code::operator_cast_to_bool((error_code *)*plVar7);
              if (bVar2) {
                async_simple::coro::detail::LazyPromise<void>::return_void(this_00);
                local_460 = 3;
              }
              else {
                local_460 = 4;
              }
            }
          }
          else {
            eVar12 = std::make_error_code(0);
            puVar1 = (undefined8 *)*plVar7;
            *puVar1 = CONCAT44(uStack_18c,eVar12._M_value);
            puVar1[1] = eVar12._M_cat;
            async_simple::coro::detail::LazyPromise<void>::return_void(this_00);
            local_460 = 3;
          }
        } while (local_460 == 0);
        if (local_460 == 4) {
          local_438 = 0;
        }
        else {
          local_438 = local_460;
        }
      }
      local_3fc = local_438;
    }
    local_3f4 = local_3fc;
  }
  fd_guard::~fd_guard((fd_guard *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
  if (local_3f4 == 0) {
    async_simple::coro::detail::LazyPromise<void>::return_void(this_00);
  }
  else if (local_3f4 != 3) goto LAB_0068f291;
  async_simple::coro::detail::LazyPromiseBase::final_suspend((LazyPromiseBase *)this_00);
  bVar2 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                    ((FinalAwaiter *)((long)puVar3 + 0x1da));
  if (!bVar2) {
    *puVar3 = 0;
    *(undefined1 *)(puVar3 + 0x3b) = 5;
    send_file_no_copy_with_chunked
              ((void *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
               (void *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    (*(code *)*extraout_RAX_03)(extraout_RAX_03);
    return (Lazy<void>)in_RDI._coro.__handle_.__handle_;
  }
  async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
            ((FinalAwaiter *)((long)puVar3 + 0x1da));
LAB_0068f291:
  async_simple::coro::detail::LazyPromise<void>::~LazyPromise((LazyPromise<void> *)0x68f2a9);
  if (puVar3 != (undefined8 *)0x0) {
    operator_delete(puVar3,0x1e0);
  }
  return (Lazy<void>)in_RDI._coro.__handle_;
}

Assistant:

async_simple::coro::Lazy<void> send_file_no_copy_with_chunked(
      const std::filesystem::path &source, std::error_code &ec) {
    fd_guard guard(source.c_str());
    if (guard.fd < 0) [[unlikely]] {
      ec = std::make_error_code(std::errc::bad_file_descriptor);
      co_return;
    }
    off_t now_position = 0,
          max_position = std::filesystem::file_size(source, ec);
    if (ec) {
      co_return;
    }
    size_t len =
        std::min<size_t>(max_single_part_size_, max_position - now_position);
    // send chunked
    std::array<char, 24> chunked_buffer;
    std::size_t sz;
    std::tie(ec, sz) = co_await async_write(
        asio::buffer(get_chuncked_buffers<true, false>(len, chunked_buffer)));
    if (ec) [[unlikely]] {
      co_return;
    }
    do {
      std::size_t actual_len = 0;
      std::tie(ec, actual_len) = co_await coro_io::async_sendfile(
          socket_->impl_, guard.fd, now_position, len);
      if (ec) [[unlikely]] {
        co_return;
      }
      if (actual_len != len) [[unlikely]] {
        // bad request, file is smaller than content-length
        ec = std::make_error_code(std::errc::invalid_argument);
        co_return;
      }
      if (now_position += actual_len; now_position < max_position) {
        len = std::min<size_t>(max_single_part_size_,
                               max_position - now_position);
        std::tie(ec, sz) = co_await async_write(asio::buffer(
            get_chuncked_buffers<false, false>(len, chunked_buffer)));
        if (ec) {
          co_return;
        }
      }
      else [[unlikely]] {
        std::tie(ec, sz) = co_await async_write(asio::buffer(
            get_chuncked_buffers<false, true>(len, chunked_buffer)));
        if (ec) {
          co_return;
        }
        break;
      }
    } while (true);
  }